

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_0::CWriter::WriteMemory(CWriter *this,string *name,Memory *memory)

{
  string local_38;
  
  (anonymous_namespace)::GetMemoryTypeString_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)memory,memory);
  WriteData(this,local_38._M_dataplus._M_p,local_38._M_string_length);
  WriteData(this," ",1);
  (anonymous_namespace)::CWriter::Write<std::__cxx11::string_const&,char_const(&)[2]>
            ((CWriter *)this,name,(char (*) [2])0x16c477);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void CWriter::WriteMemory(const std::string& name, const Memory& memory) {
  Write(GetMemoryTypeString(memory), " ", name, ";");
}